

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Tbc::Text::spliceLine(Text *this,size_t _indent,string *_remainder,size_t _pos)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_58,(char)_indent);
  std::__cxx11::string::substr((ulong)&local_38,(ulong)_remainder);
  std::operator+(&bStack_78,&local_58,&local_38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->lines,&bStack_78);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::substr((ulong)&bStack_78,(ulong)_remainder);
  std::__cxx11::string::_M_assign((string *)_remainder);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void spliceLine( std::size_t _indent, std::string& _remainder, std::size_t _pos ) {
            lines.push_back( std::string( _indent, ' ' ) + _remainder.substr( 0, _pos ) );
            _remainder = _remainder.substr( _pos );
        }